

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

void absl::anon_unknown_0::AppendNumberUnit(string *out,int64_t n,DisplayUnit unit)

{
  char *pcVar1;
  const_pointer __s;
  size_type in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *bp;
  char *ep;
  char buf [17];
  int64_t n_local;
  string *out_local;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit;
  pcVar1 = Format64(buf + 9,0,n);
  if ((*pcVar1 != '0') || (pcVar1 + 1 != buf + 9)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __s = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this,__s,(size_type)out);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, int64_t n, DisplayUnit unit) {
  char buf[sizeof("2562047788015216")];  // hours in max duration
  char* const ep = buf + sizeof(buf);
  char* bp = Format64(ep, 0, n);
  if (*bp != '0' || bp + 1 != ep) {
    out->append(bp, ep - bp);
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}